

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

void b_array::split<Map::Pair<int,std::__cxx11::string>>
               (Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *data1,size_t *size1,
               Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *data2,size_t *size2)

{
  ulong uVar1;
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar2;
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar3;
  size_t sVar4;
  size_t index;
  ulong uVar5;
  
  uVar1 = *size1;
  uVar5 = uVar1 + 1 >> 1;
  sVar4 = uVar1 - uVar5;
  if (uVar5 <= uVar1 && sVar4 != 0) {
    index = 0;
    do {
      pPVar2 = Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](data1,uVar5 + index);
      pPVar3 = Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](data2,index);
      pPVar3->key = pPVar2->key;
      std::__cxx11::string::_M_assign((string *)&pPVar3->value);
      index = index + 1;
    } while (sVar4 != index);
  }
  *size1 = uVar5;
  *size2 = sVar4;
  return;
}

Assistant:

void split(b_array::Array<T>& data1, size_t& size1, b_array::Array<T>& data2, size_t& size2) {
    size_t size = size1;
    for (size_t i = ((size + 1) / 2); i < size; i++) {
        data2[i - ((size + 1) / 2)] = data1[i];
    }
    size1 = (size + 1) / 2;
    size2 = size - size1;
}